

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_field_small_operators.h
# Opt level: O3

Element_conflict __thiscall
Gudhi::persistence_fields::Multi_field_operators_with_small_characteristics::
get_partial_multiplicative_identity
          (Multi_field_operators_with_small_characteristics *this,
          Characteristic *productOfCharacteristics)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  uint uVar4;
  ulong uVar5;
  Element_conflict EVar6;
  long lVar7;
  
  if (*productOfCharacteristics == 0) {
    EVar6 = 1;
  }
  else {
    puVar3 = (this->primes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    lVar7 = (long)(this->primes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
    if (lVar7 == 0) {
      EVar6 = 0;
    }
    else {
      uVar1 = this->productOfAllCharacteristics_;
      uVar5 = 0;
      EVar6 = 0;
      do {
        if (*productOfCharacteristics % puVar3[uVar5] == 0) {
          uVar2 = (this->partials_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar5];
          uVar4 = uVar1;
          if (EVar6 + uVar2 < uVar1) {
            uVar4 = 0;
          }
          if (CARRY4(EVar6,uVar2)) {
            uVar4 = uVar1;
          }
          EVar6 = (EVar6 + uVar2) - uVar4;
        }
        uVar5 = uVar5 + 1;
      } while ((uVar5 & 0xffffffff) < (ulong)(lVar7 >> 2));
    }
  }
  return EVar6;
}

Assistant:

Element get_partial_multiplicative_identity(const Characteristic& productOfCharacteristics) const {
    if (productOfCharacteristics == 0) {
      return get_multiplicative_identity();
    }
    Element multIdentity = 0;
    for (unsigned int idx = 0; idx < primes_.size(); ++idx) {
      if ((productOfCharacteristics % primes_[idx]) == 0) {
        multIdentity = _add(multIdentity, partials_[idx], productOfAllCharacteristics_);
      }
    }
    return multIdentity;
  }